

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.hpp
# Opt level: O0

int __thiscall
re::beatnik::viterbi<float,_256L>::decode(viterbi<float,_256L> *this,span<const_float,_256L> input)

{
  const_iterator first;
  const_iterator last;
  reference pvVar1;
  element<float> eVar2;
  span<float,_256L> local_28;
  storage_type<gsl::details::extent_type<256L>_> local_20;
  viterbi<float,_256L> *local_18;
  viterbi<float,_256L> *this_local;
  span<const_float,_256L> input_local;
  
  local_20 = input.storage_.data_;
  local_18 = this;
  this_local = (viterbi<float,_256L> *)input.storage_.data_;
  calculate_transition(this,input);
  gsl::span<float,256l>::span<256ul,float>((span<float,256l> *)&local_28,&this->delta);
  math::normalize<float,256l>(local_28);
  first = ::std::cbegin<std::array<float,256ul>>(&this->delta);
  last = ::std::cend<std::array<float,256ul>>(&this->delta);
  eVar2 = math::element<float>::max<float_const*>(first,last);
  pvVar1 = std::array<long,_256UL>::operator[](&this->psi,eVar2.index);
  return (int)*pvVar1;
}

Assistant:

int
    decode(gsl::span<T const, N> input) noexcept
    {
        calculate_transition(input);
        math::normalize(gsl::span<T, N>(delta));

        return psi[
            math::element<T>::max(
                std::cbegin(delta),
                std::cend(delta)
            ).index
        ];
    }